

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::expectCancel(TestMoreStuffImpl *this,ExpectCancelContext context)

{
  Client cap;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  local_88;
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  Reader local_50;
  
  CallContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::getParams(&local_50,&local_88);
  capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams::Reader::getCap
            ((Client *)local_68,&local_50);
  capnproto_test::capnp::test::TestInterface::Client::Client((Client *)local_80,(Client *)local_68);
  loop(this,(uint)context.hook,(Client *)0x0,(CallContextHook *)local_80);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_80 + 8));
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_68 + 8));
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::expectCancel(ExpectCancelContext context) {
  auto cap = context.getParams().getCap();
  return loop(0, cap, context);
}